

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaching-definitions-transfer-function.h
# Opt level: O1

void __thiscall
wasm::analysis::ReachingDefinitionsTransferFunction::evaluateFunctionEntry
          (ReachingDefinitionsTransferFunction *this,Function *func,Element *inputState)

{
  ulong *puVar1;
  ulong uVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  key_type local_38;
  
  p_Var5 = (this->fakeSetPtrs)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      local_38 = (key_type)p_Var5[1]._M_nxt;
      pmVar3 = std::__detail::
               _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_long>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_long>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&(this->lattice).memberIndices,&local_38);
      uVar2 = *pmVar3;
      uVar4 = uVar2 + 0x3f;
      if (-1 < (long)uVar2) {
        uVar4 = uVar2;
      }
      puVar1 = (ulong *)(((long)uVar4 >> 6) * 8 +
                         (long)(inputState->bitvector).super__Bvector_base<std::allocator<bool>_>.
                               _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                               _M_p + -8 +
                        (ulong)((uVar2 & 0x800000000000003f) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void
  evaluateFunctionEntry(Function* func,
                        FinitePowersetLattice<LocalSet*>::Element& inputState) {
    for (auto currSet : fakeSetPtrs) {
      lattice.add(&inputState, currSet);
    }
  }